

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression *
slang::ast::Expression::bindSelector
          (Compilation *compilation,Expression *value,ElementSelectSyntax *syntax,
          ASTContext *context)

{
  SourceLocation syntax_00;
  Diagnostic *this;
  Expression *pEVar1;
  SourceRange SVar2;
  SourceRange fullRange;
  SourceRange fullRange_00;
  ASTContext *in_stack_00000008;
  
  pEVar1 = (Expression *)syntax->selector;
  if (pEVar1 == (Expression *)0x0) {
    SVar2 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x10001,SVar2);
  }
  else {
    if (value->kind != RangeSelect) {
      syntax_00 = (value->sourceRange).startLoc;
      SVar2 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      if (pEVar1->kind == (Dist|Call)) {
        fullRange.endLoc = (SourceLocation)context;
        fullRange.startLoc = SVar2.endLoc;
        pEVar1 = ElementSelectExpression::fromSyntax
                           ((ElementSelectExpression *)compilation,(Compilation *)value,
                            (Expression *)pEVar1->syntax,(ExpressionSyntax *)syntax_00,fullRange,
                            in_stack_00000008);
        return pEVar1;
      }
      fullRange_00.endLoc = (SourceLocation)context;
      fullRange_00.startLoc = SVar2.endLoc;
      pEVar1 = RangeSelectExpression::fromSyntax
                         ((RangeSelectExpression *)compilation,(Compilation *)value,pEVar1,
                          (RangeSelectSyntax *)syntax_00,fullRange_00,in_stack_00000008);
      return pEVar1;
    }
    SVar2 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    this = ASTContext::addDiag(context,(DiagCode)0x940007,SVar2);
    Diagnostic::operator<<(this,value->sourceRange);
  }
  pEVar1 = badExpr(compilation,(Expression *)0x0);
  return pEVar1;
}

Assistant:

Expression& Expression::bindSelector(Compilation& compilation, Expression& value,
                                     const ElementSelectSyntax& syntax, const ASTContext& context) {
    const SelectorSyntax* selector = syntax.selector;
    if (!selector) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (value.kind == ExpressionKind::RangeSelect) {
        context.addDiag(diag::SelectAfterRangeSelect, syntax.sourceRange()) << value.sourceRange;
        return badExpr(compilation, nullptr);
    }

    // The full source range of the expression includes the value and the selector syntax.
    SourceRange fullRange = {value.sourceRange.start(), syntax.sourceRange().end()};

    switch (selector->kind) {
        case SyntaxKind::BitSelect:
            return ElementSelectExpression::fromSyntax(compilation, value,
                                                       *selector->as<BitSelectSyntax>().expr,
                                                       fullRange, context);
        case SyntaxKind::SimpleRangeSelect:
        case SyntaxKind::AscendingRangeSelect:
        case SyntaxKind::DescendingRangeSelect:
            return RangeSelectExpression::fromSyntax(compilation, value,
                                                     selector->as<RangeSelectSyntax>(), fullRange,
                                                     context);
        default:
            SLANG_UNREACHABLE;
    }
}